

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Slider.cxx
# Opt level: O0

void __thiscall Fl_Nice_Slider::Fl_Nice_Slider(Fl_Nice_Slider *this,int X,int Y,int W,int H,char *L)

{
  char *L_local;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Nice_Slider *this_local;
  
  Fl_Slider::Fl_Slider(&this->super_Fl_Slider,X,Y,W,H,L);
  (this->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Nice_Slider_002ed778;
  Fl_Widget::type((Fl_Widget *)this,'\x04');
  Fl_Widget::box((Fl_Widget *)this,FL_FLAT_BOX);
  return;
}

Assistant:

Fl_Nice_Slider::Fl_Nice_Slider(int X,int Y,int W,int H,const char *L)
: Fl_Slider(X,Y,W,H,L) {
  type(FL_VERT_NICE_SLIDER); 
  box(FL_FLAT_BOX);
}